

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.hpp
# Opt level: O2

void __thiscall
InstructionSet::x86::Instruction<true>::Instruction
          (Instruction<true> *this,Operation operation,Source source,Source destination,
          ScaleIndexBase sib,bool lock,AddressSize address_size,Source segment_override,
          DataSize data_size,DisplacementT displacement,ImmediateT operand)

{
  DataPointer DVar1;
  undefined8 in_RAX;
  ushort uVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Source SVar3;
  bool bVar4;
  undefined8 uStack_18;
  
  this->operation_ = operation;
  SVar3 = C0;
  if ((int)CONCAT71(in_register_00000011,source) == 0x18) {
    SVar3 = sib.sib_ & BH;
  }
  SVar3 = SVar3 | (operand != 0) << 5 | (displacement != 0) << 6 | address_size << 7 | source;
  this->mem_exts_source_ = SVar3;
  uVar2 = (ushort)(sib.sib_ & BH);
  if ((int)CONCAT71(in_register_00000009,destination) != 0x18) {
    uVar2 = 0;
  }
  this->source_data_dest_sib_ =
       uVar2 | (ushort)CONCAT71(in_register_00000009,destination) & 0xff |
       ((ushort)lock << 0xd | (ushort)data_size << 0xe) + (sib.sib_ & 0xf8) * 4;
  this->extensions_[0] = 0;
  this->extensions_[1] = 0;
  bVar4 = (SVar3 & 0x20) != C0;
  if (bVar4) {
    this->extensions_[0] = operand;
  }
  if ((SVar3 & 0x40) != C0) {
    this->extensions_[bVar4] = displacement;
  }
  if (segment_override == None) {
    uStack_18 = in_RAX;
    DVar1 = Instruction<true>::source(this);
    uStack_18 = CONCAT26(DVar1,(undefined6)uStack_18);
    segment_override = DataPointer::default_segment((DataPointer *)((long)&uStack_18 + 6));
    if (segment_override == None) {
      DVar1 = Instruction<true>::destination(this);
      uStack_18._0_6_ = CONCAT24(DVar1,(undefined4)uStack_18);
      segment_override = DataPointer::default_segment((DataPointer *)((long)&uStack_18 + 4));
    }
  }
  uVar2 = 3;
  if (segment_override != None) {
    uVar2 = (ushort)(segment_override & BH);
  }
  this->source_data_dest_sib_ = this->source_data_dest_sib_ | uVar2 << 10;
  return;
}

Assistant:

constexpr Instruction(
			Operation operation,
			Source source,
			Source destination,
			ScaleIndexBase sib,
			bool lock,
			AddressSize address_size,
			Source segment_override,
			DataSize data_size,
			DisplacementT displacement,
			ImmediateT operand) noexcept :
				operation_(operation),
				mem_exts_source_(uint8_t(
					(int(address_size) << 7) |
					(displacement ? 0x40 : 0x00) |
					(operand ? 0x20 : 0x00) |
					int(source) |
					(source == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)),
				source_data_dest_sib_(uint16_t(
					(int(data_size) << 14) |
					(lock ? (1 << 13) : 0) |
					((uint8_t(sib) & 0xf8) << 2) |
					int(destination) |
					(destination == Source::Indirect ? (uint8_t(sib) & 7) : 0)
				)) {
			// Decisions on whether to include operand, displacement and/or size extension words
			// have implicitly been made in the int packing above; honour them here.
			int extension = 0;
			if(has_operand()) {
				extensions_[extension] = operand;
				++extension;
			}
			if(has_displacement()) {
				extensions_[extension] = ImmediateT(displacement);
				++extension;
			}

			// Patch in a fully-resolved segment.
			Source segment = segment_override;
			if(segment == Source::None) segment = this->source().default_segment();
			if(segment == Source::None) segment = this->destination().default_segment();
			if(segment == Source::None) segment = Source::DS;
			source_data_dest_sib_ |= (int(segment)&7) << 10;
		}